

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O0

size_t __thiscall
ans_reorder_fold_encode<4U>::serialize(ans_reorder_fold_encode<4U> *this,uint8_t **out_u8)

{
  reference pvVar1;
  size_t sVar2;
  long *in_RSI;
  long in_RDI;
  size_t interp_written_bytes;
  size_t i;
  size_t bytes_written;
  uint32_t *out_ptr_u32;
  size_t no_except_thres;
  uint8_t **in_stack_00000060;
  size_t in_stack_00000068;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000070;
  size_type local_30;
  long local_28;
  value_type *local_20;
  
  local_20 = (value_type *)*in_RSI;
  if (*(ulong *)(in_RDI + 0x70) < 0x800) {
    *local_20 = 0;
    local_28 = 4;
  }
  else {
    *local_20 = 1;
    for (local_30 = 0; local_20 = local_20 + 1, local_30 < 0x800; local_30 = local_30 + 1) {
      pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x48),
                          local_30);
      *local_20 = *pvVar1;
    }
    *in_RSI = *in_RSI + 0x2000;
    local_28 = 0x2004;
  }
  *in_RSI = *in_RSI + 4;
  sVar2 = ans_serialize_interp(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  return sVar2 + local_28 + 4;
}

Assistant:

size_t serialize(uint8_t*& out_u8)
    {
        size_t no_except_thres = 1 << (fidelity + 8 - 1);
        auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
        size_t bytes_written = 0;
        if (sigma < no_except_thres) {
            *out_ptr_u32++ = 0;
            bytes_written += sizeof(uint32_t);
        } else {
            *out_ptr_u32++ = 1;
            bytes_written += sizeof(uint32_t);
            for (size_t i = 0; i < no_except_thres; i++) {
                *out_ptr_u32++ = most_frequent[i];
            }
            out_u8 += sizeof(uint32_t) * no_except_thres;
            bytes_written += sizeof(uint32_t) * no_except_thres;
        }
        out_u8 += sizeof(uint32_t);
        bytes_written += sizeof(uint32_t);
        auto interp_written_bytes
            = ans_serialize_interp(nfreqs, frame_size, out_u8);
        return interp_written_bytes + bytes_written;
    }